

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O1

bool tinygltf::ParseBooleanProperty
               (bool *ret,string *err,json *o,string *property,bool required,string *parent_node)

{
  value_t vVar1;
  bool bVar2;
  reference j;
  bool ret_1;
  json_const_iterator it;
  boolean_t local_49;
  json_const_iterator local_48;
  
  local_48.m_object = (pointer)0x0;
  local_48.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_48.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_48.m_it.primitive_iterator.m_it = -0x8000000000000000;
  bVar2 = anon_unknown_57::FindMember((json *)err,*(char **)o,&local_48);
  if (bVar2) {
    j = nlohmann::detail::
        iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator*(&local_48);
    vVar1 = j->m_type;
    bVar2 = vVar1 == boolean;
    if (bVar2) {
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (j,&local_49);
    }
    else {
      local_49 = false;
    }
    if (ret != (bool *)0x0 && vVar1 == boolean) {
      *ret = local_49;
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool ParseBooleanProperty(bool *ret, std::string *err, const json &o,
                                 const std::string &property,
                                 const bool required,
                                 const std::string &parent_node = "") {
  json_const_iterator it;
  if (!FindMember(o, property.c_str(), it)) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is missing";
        if (!parent_node.empty()) {
          (*err) += " in " + parent_node;
        }
        (*err) += ".\n";
      }
    }
    return false;
  }

  auto &value = GetValue(it);

  bool isBoolean;
  bool boolValue = false;
#ifdef TINYGLTF_USE_RAPIDJSON
  isBoolean = value.IsBool();
  if (isBoolean) {
    boolValue = value.GetBool();
  }
#else
  isBoolean = value.is_boolean();
  if (isBoolean) {
    boolValue = value.get<bool>();
  }
#endif
  if (!isBoolean) {
    if (required) {
      if (err) {
        (*err) += "'" + property + "' property is not a bool type.\n";
      }
    }
    return false;
  }

  if (ret) {
    (*ret) = boolValue;
  }

  return true;
}